

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapeLinear>::ComputeVecandShape(TPZShapeData *data)

{
  pair<int,_long> *ppVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  MElementType MVar10;
  int *piVar11;
  ostream *this;
  long *plVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iside;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int maxorder [3];
  TPZManVector<int,_3> VectorSides;
  TPZManVector<int,_3> normalsides;
  TPZManVector<int,_3> directions;
  TPZManVector<int,_3> bilinear;
  TPZGenMatrix<int> shapeorders;
  TPZManVector<int,_27> permgather;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_81> vecpermute;
  int local_42c [3];
  TPZVec<int> *local_420;
  ulong local_418;
  long local_410;
  ulong local_408;
  ulong local_400;
  long local_3f8;
  int local_3ec;
  long local_3e8;
  TPZVec<int> local_3e0;
  int local_3c0 [4];
  TPZVec<int> local_3b0;
  int local_390 [4];
  TPZVec<int> local_380;
  int local_360 [4];
  TPZVec<int> local_350;
  int local_330 [4];
  TPZManVector<int,_10> local_320;
  undefined1 local_2d8 [24];
  undefined1 local_2c0 [16];
  TPZManVector<int,_10> local_1e0;
  TPZVec<int> local_198;
  int local_178 [82];
  
  TPZVec<int>::TPZVec(&local_3e0,0);
  local_3e0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_3e0.fStore = local_3c0;
  local_3e0.fNElements = 3;
  local_3e0.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_350,0);
  local_350.fStore = local_330;
  local_350._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_350.fNElements = 3;
  local_350.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_380,0);
  local_380.fStore = local_360;
  local_380._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_380.fNElements = 3;
  local_380.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_3b0,0);
  local_3b0.fStore = local_390;
  local_3b0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_3b0.fNElements = 3;
  local_3b0.fNAlloc = 0;
  pztopology::TPZLine::GetSideHDivDirections(&local_3e0,&local_380,&local_350,&local_3b0);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  local_3ec = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[2];
  iVar6 = pzshape::TPZShapeLinear::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  local_198._vptr_TPZVec = (_func_int **)CONCAT44(local_198._vptr_TPZVec._4_4_,2);
  TPZManVector<int,_10>::TPZManVector(&local_1e0,local_3e0.fNElements,(int *)&local_198);
  local_418 = CONCAT44(local_418._4_4_,iVar6);
  uVar17 = 0;
  local_420 = &(data->fH1ConnectOrders).super_TPZVec<int>;
  TPZVec<int>::TPZVec(&local_198,0);
  local_198.fStore = local_178;
  local_198._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_198.fNElements = 3;
  local_198.fNAlloc = 0;
  iVar6 = 0;
  do {
    iVar7 = pztopology::TPZLine::SideDimension(iVar6);
    if (iVar7 == 0) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_320);
      pztopology::TPZLine::LowerDimensionSides(iVar6,(TPZStack<int,_10> *)&local_320);
      uVar5 = (uint)local_320.super_TPZVec<int>.fNElements;
      uVar9 = (uint)local_320.super_TPZVec<int>.fNElements + 1;
      TPZManVector<int,_27>::TPZManVector((TPZManVector<int,_27> *)local_2d8,(long)(int)uVar9);
      HDivPermutation(iVar6,data,(TPZVec<int> *)local_2d8);
      if (uVar5 < 0x7fffffff) {
        iVar7 = (int)uVar17;
        uVar17 = 0;
        do {
          local_198.fStore[(long)iVar7 + uVar17] = *(int *)(local_2d8._8_8_ + uVar17 * 4) + iVar7;
          local_1e0.super_TPZVec<int>.fStore[(long)iVar7 + uVar17] = iVar6;
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
        uVar17 = (ulong)(uint)(iVar7 + (int)uVar17);
      }
      if ((undefined1 *)local_2d8._8_8_ != local_2c0 + 8) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_2c0._8_8_;
        local_2c0 = auVar2 << 0x40;
        local_2d8._0_8_ = &PTR__TPZVec_01813ef0;
        if ((long *)local_2d8._8_8_ != (long *)0x0) {
          operator_delete__((void *)local_2d8._8_8_);
        }
      }
      TPZManVector<int,_10>::~TPZManVector(&local_320);
    }
    auVar4 = _DAT_014d28c0;
    auVar2 = _DAT_014d28b0;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  lVar18 = (long)(int)uVar17;
  lVar13 = local_198.fNElements - lVar18;
  if (lVar13 != 0 && lVar18 <= local_198.fNElements) {
    lVar14 = lVar13 + -1;
    auVar21._8_4_ = (int)lVar14;
    auVar21._0_8_ = lVar14;
    auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar15 = 0;
    auVar21 = auVar21 ^ _DAT_014d28c0;
    uVar16 = uVar17;
    do {
      auVar22._8_4_ = (int)uVar15;
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = (int)(uVar15 >> 0x20);
      auVar22 = (auVar22 | auVar2) ^ auVar4;
      iVar6 = (int)uVar16;
      if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                  auVar21._4_4_ < auVar22._4_4_) & 1)) {
        local_198.fStore[lVar18 + uVar15] = iVar6;
      }
      if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
          auVar22._12_4_ <= auVar21._12_4_) {
        local_198.fStore[lVar18 + uVar15 + 1] = iVar6 + 1;
      }
      uVar15 = uVar15 + 2;
      uVar16 = (ulong)(iVar6 + 2);
    } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar15);
  }
  TPZGenMatrix<int>::TPZGenMatrix((TPZGenMatrix<int> *)&local_320,(long)(int)local_418,3);
  pzshape::TPZShapeLinear::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,local_420,(TPZGenMatrix<int> *)&local_320);
  iVar6 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[2];
  iVar7 = 0;
  TPZVec<long>::TPZVec((TPZVec<long> *)local_2d8,0);
  local_2d8._0_8_ = &PTR__TPZManVector_018bd790;
  local_2d8._8_8_ = local_2c0 + 8;
  local_2d8._16_8_ = 4;
  local_2c0 = (undefined1  [16])0x0;
  lVar13 = 0;
  do {
    iVar8 = 1;
    if (lVar13 == 2) {
      iVar8 = iVar6 + 1;
    }
    iVar8 = pzshape::TPZShapeLinear::NConnectShapeF((int)lVar13,iVar8);
    iVar7 = iVar7 + iVar8;
    *(long *)(local_2d8._8_8_ + (lVar13 + 1) * 8) = (long)iVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  local_3e8 = local_3e0.fNElements;
  local_410 = lVar18;
  if ((int)uVar17 < 1) {
    uVar16 = 0;
  }
  else {
    uVar15 = 0;
    uVar16 = 0;
    local_408 = uVar17;
    do {
      local_3f8 = (long)local_198.fStore[uVar15];
      local_420 = (TPZVec<int> *)(long)local_3e0.fStore[local_3f8];
      lVar13 = *(long *)(local_2d8._8_8_ + (undefined1 *)((long)&local_420->_vptr_TPZVec + 1) * 8);
      local_400 = uVar15;
      if ((int)*(long *)(local_2d8._8_8_ + local_420 * 8) < (int)lVar13) {
        iVar6 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
                [local_1e0.super_TPZVec<int>.fStore[uVar15]];
        lVar18 = (long)(int)*(long *)(local_2d8._8_8_ + local_420 * 8);
        do {
          uVar9 = pztopology::TPZLine::SideDimension((int)local_420);
          if ((int)uVar9 < 1) {
LAB_01003279:
            iVar7 = (int)uVar16;
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_3f8;
            ppVar1[iVar7].second = lVar18;
            uVar16 = (ulong)(iVar7 + 1);
          }
          else {
            bVar3 = true;
            uVar17 = 0;
            local_418 = uVar16;
            do {
              piVar11 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_320,lVar18,uVar17)
              ;
              if (iVar6 < *piVar11) {
                bVar3 = false;
              }
              uVar17 = uVar17 + 1;
            } while (uVar9 != uVar17);
            uVar16 = local_418;
            if (bVar3) goto LAB_01003279;
          }
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 != (int)lVar13);
      }
      uVar15 = local_400 + 1;
    } while (uVar15 != local_408);
  }
  lVar13 = local_410;
  if (local_410 < local_3e8) {
    do {
      local_3f8 = (long)local_198.fStore[lVar13];
      iVar6 = local_3e0.fStore[local_3f8];
      local_420 = (TPZVec<int> *)CONCAT44(local_420._4_4_,local_350.fStore[local_3f8]);
      local_400 = (ulong)local_380.fStore[local_3f8];
      local_410 = lVar13;
      MVar10 = pztopology::TPZLine::Type(iVar6);
      lVar13 = *(long *)(local_2d8._8_8_ + ((long)iVar6 + 1) * 8);
      if ((int)*(long *)(local_2d8._8_8_ + (long)iVar6 * 8) < (int)lVar13) {
        lVar18 = (long)(int)*(long *)(local_2d8._8_8_ + (long)iVar6 * 8);
        local_408 = CONCAT44(local_408._4_4_,iVar6);
        do {
          uVar9 = pztopology::TPZLine::SideDimension(iVar6);
          local_42c[0] = local_3ec;
          local_42c[1] = local_3ec;
          local_42c[2] = local_3ec;
          if ((int)local_420 != 0) {
            local_42c[local_400] = local_42c[local_400] + 1;
          }
          if ((int)uVar9 < 1) {
LAB_01003468:
            iVar7 = (int)uVar16;
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_3f8;
            ppVar1[iVar7].second = lVar18;
            uVar16 = (ulong)(iVar7 + 1);
          }
          else {
            bVar3 = true;
            uVar17 = 0;
            local_418 = uVar16;
            do {
              switch(MVar10) {
              case EOned:
                piVar11 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_320,lVar18,0);
                break;
              case ETriangle:
              case ETetraedro:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar18,uVar17);
                iVar8 = local_42c[uVar17] + 1;
                iVar6 = *piVar11;
                bVar20 = SBORROW4(iVar6,iVar8);
                iVar7 = iVar6 - iVar8;
                bVar19 = iVar6 == iVar8;
                goto LAB_0100343f;
              case EQuadrilateral:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar18,uVar17);
                break;
              case EPiramide:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar18,uVar17);
                break;
              case EPrisma:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar18,uVar17);
                break;
              case ECube:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar18,uVar17);
                break;
              default:
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                           ,0x104);
              }
              iVar8 = *piVar11;
              iVar6 = local_42c[uVar17];
              bVar20 = SBORROW4(iVar8,iVar6);
              iVar7 = iVar8 - iVar6;
              bVar19 = iVar8 == iVar6;
LAB_0100343f:
              if (!bVar19 && bVar20 == iVar7 < 0) {
                bVar3 = false;
              }
              uVar17 = uVar17 + 1;
            } while (uVar9 != uVar17);
            uVar16 = local_418;
            iVar6 = (int)local_408;
            if (bVar3) goto LAB_01003468;
          }
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 != (int)lVar13);
      }
      lVar13 = local_410 + 1;
    } while (local_410 + 1 < local_3e8);
  }
  iVar6 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
  if ((int)uVar16 == iVar6) {
    if ((undefined1 *)local_2d8._8_8_ != local_2c0 + 8) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_2c0._8_8_;
      local_2c0 = auVar4 << 0x40;
      local_2d8._0_8_ = &PTR__TPZVec_01813f30;
      if ((long *)local_2d8._8_8_ != (long *)0x0) {
        operator_delete__((void *)local_2d8._8_8_);
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)&local_320);
    if (local_198.fStore != local_178) {
      local_198.fNAlloc = 0;
      local_198._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_198.fStore != (int *)0x0) {
        operator_delete__(local_198.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_1e0);
    if (local_3b0.fStore != local_390) {
      local_3b0.fNAlloc = 0;
      local_3b0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_3b0.fStore != (int *)0x0) {
        operator_delete__(local_3b0.fStore);
      }
    }
    if (local_380.fStore != local_360) {
      local_380.fNAlloc = 0;
      local_380._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_380.fStore != (int *)0x0) {
        operator_delete__(local_380.fStore);
      }
    }
    if (local_350.fStore != local_330) {
      local_350.fNAlloc = 0;
      local_350._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_350.fStore != (int *)0x0) {
        operator_delete__(local_350.fStore);
      }
    }
    if (local_3e0.fStore != local_3c0) {
      local_3e0.fNAlloc = 0;
      local_3e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_3e0.fStore != (int *)0x0) {
        operator_delete__(local_3e0.fStore);
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count ",6);
  this = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar16);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\nivs ",5);
  plVar12 = (long *)std::ostream::operator<<(this,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x113);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}